

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pretty.cpp
# Opt level: O3

string * __thiscall
cli::getPrettyCompression_abi_cxx11_
          (string *__return_storage_ptr__,cli *this,Compression compression)

{
  char *pcVar1;
  char *pcVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if ((int)this == 1) {
    pcVar2 = "LZ4";
    pcVar1 = "";
  }
  else if ((int)this == 0) {
    pcVar2 = "None";
    pcVar1 = "";
  }
  else {
    pcVar2 = "Unknown";
    pcVar1 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar2,pcVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string getPrettyCompression(ZAP::Compression compression)
	{
		switch (compression)
		{
		case ZAP::Compression::NONE: return "None";
		case ZAP::Compression::LZ4:  return "LZ4";
		default: return "Unknown";
		}
	}